

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManUpdate(Fx_Man_t *p,int iDiv,int *fWarning)

{
  long lVar1;
  Vec_Int_t *p_00;
  Hsh_VecMan_t *pHVar2;
  Vec_Wec_t *pVVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int t;
  uint uVar12;
  Vec_Int_t *pVVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  Vec_Wec_t *pVVar23;
  int *piVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  Vec_Int_t *pVVar28;
  int *piVar29;
  int *piVar30;
  long lVar31;
  bool bVar32;
  float fVar33;
  int *in_stack_ffffffffffffff80;
  Vec_Int_t *local_68;
  Vec_Int_t *local_48;
  
  if (iDiv < 0) {
LAB_002cf582:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  if (p->vWeights->nSize <= iDiv) goto LAB_002cf582;
  fVar33 = p->vWeights->pArray[(uint)iDiv];
  fVar33 = fVar33 - (float)(int)fVar33;
  if ((fVar33 <= 0.0) || (1.0 <= fVar33)) {
    __assert_fail("Diff > 0.0 && Diff < 1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x3cb,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  p_00 = p->vDiv;
  p->nDivs = p->nDivs + 1;
  p_00->nSize = 0;
  pHVar2 = p->pHash;
  if (pHVar2->vMap->nSize <= iDiv) {
LAB_002cf40e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar17 = pHVar2->vMap->pArray[(uint)iDiv];
  if (((long)iVar17 < 0) || (pHVar2->vData->nSize <= iVar17)) {
LAB_002cf563:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = pHVar2->vData->pArray + iVar17;
  iVar17 = *piVar4;
  (pHVar2->vTemp).nCap = iVar17;
  (pHVar2->vTemp).nSize = iVar17;
  (pHVar2->vTemp).pArray = piVar4 + 2;
  if (0 < iVar17) {
    lVar31 = 0;
    do {
      Vec_IntPush(p_00,(pHVar2->vTemp).pArray[lVar31]);
      lVar31 = lVar31 + 1;
    } while (lVar31 < (pHVar2->vTemp).nSize);
  }
  if ((long)p_00->nSize < 1) {
LAB_002cf5a1:
    __assert_fail("Lit0 >= 0 && Lit1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x3d2,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  uVar25 = 0xffffffff;
  lVar31 = 0;
  uVar26 = 0xffffffff;
  uVar12 = 0xffffffff;
  uVar22 = 0xffffffff;
  do {
    uVar21 = p_00->pArray[lVar31];
    if ((int)uVar21 < 0) goto LAB_002cf4e7;
    if ((uVar21 & 1) == 0) {
      if (uVar25 != 0xffffffff) goto LAB_002cdd58;
      uVar25 = uVar21 >> 1;
      uVar12 = uVar26;
LAB_002cdd5d:
      uVar22 = uVar12;
      uVar12 = uVar22;
      if (-1 < (int)uVar22) break;
    }
    else {
      if (uVar22 == 0xffffffff) {
        uVar22 = uVar21 >> 1;
        uVar26 = uVar22;
        uVar12 = uVar22;
      }
LAB_002cdd58:
      if (-1 < (int)uVar25) goto LAB_002cdd5d;
    }
    lVar31 = lVar31 + 1;
  } while (p_00->nSize != lVar31);
  if (((int)uVar25 < 0) || ((int)uVar26 < 0)) goto LAB_002cf5a1;
  pVVar8 = p->vCubesS;
  pVVar8->nSize = 0;
  pVVar23 = p->vCubes;
  if (p_00->nSize == 2) {
    pVVar3 = p->vLits;
    uVar12 = uVar25 ^ 1;
    if (pVVar3->nSize <= (int)uVar12) goto LAB_002cf3ef;
    pVVar28 = pVVar3->pArray;
    uVar22 = pVVar28[uVar12].nSize;
    if ((int)uVar22 < 1) {
      uVar21 = 0;
    }
    else {
      piVar4 = pVVar28[uVar12].pArray;
      lVar31 = 0;
      uVar21 = 0;
      do {
        iVar17 = piVar4[lVar31];
        if (((long)iVar17 < 0) || (pVVar23->nSize <= iVar17)) goto LAB_002cf3ef;
        if (0 < pVVar23->pArray[iVar17].nSize) {
          if (((int)uVar21 < 0) || (uVar22 <= uVar21)) goto LAB_002cf48a;
          uVar16 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
          piVar4[uVar16] = iVar17;
          uVar22 = pVVar28[uVar12].nSize;
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 < (int)uVar22);
    }
    if ((int)uVar22 < (int)uVar21) goto LAB_002cf4a9;
    pVVar28[uVar12].nSize = uVar21;
    uVar22 = uVar26 ^ 1;
    if (pVVar3->nSize <= (int)uVar22) goto LAB_002cf3ef;
    uVar21 = pVVar28[uVar22].nSize;
    if ((int)uVar21 < 1) {
      uVar15 = 0;
    }
    else {
      piVar4 = pVVar28[uVar22].pArray;
      lVar31 = 0;
      uVar15 = 0;
      do {
        iVar17 = piVar4[lVar31];
        if (((long)iVar17 < 0) || (pVVar23->nSize <= iVar17)) goto LAB_002cf3ef;
        if (0 < pVVar23->pArray[iVar17].nSize) {
          if (((int)uVar15 < 0) || (uVar21 <= uVar15)) goto LAB_002cf48a;
          uVar16 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          piVar4[uVar16] = iVar17;
          uVar21 = pVVar28[uVar22].nSize;
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 < (int)uVar21);
    }
    if ((int)uVar21 < (int)uVar15) goto LAB_002cf4a9;
    pVVar28[uVar22].nSize = uVar15;
    if ((pVVar3->nSize <= (int)uVar12) || (pVVar3->nSize <= (int)uVar22)) goto LAB_002cf3ef;
    piVar24 = pVVar28[uVar12].pArray;
    piVar18 = pVVar28[uVar22].pArray;
    iVar17 = pVVar28[uVar12].nSize;
    piVar4 = piVar24 + iVar17;
    piVar30 = piVar18 + (int)uVar15;
    pVVar8->nSize = 0;
    piVar19 = piVar18;
    piVar29 = piVar24;
    if ((0 < (int)uVar15) && (0 < iVar17)) {
      do {
        iVar17 = *piVar29;
        iVar7 = *piVar18;
        if (iVar17 == iVar7) {
          Vec_IntPush(pVVar8,iVar17);
          piVar29 = piVar29 + 1;
          piVar18 = piVar18 + 1;
        }
        else if (iVar17 < iVar7) {
          piVar29 = piVar29 + 1;
          *piVar24 = iVar17;
          piVar24 = piVar24 + 1;
        }
        else {
          piVar18 = piVar18 + 1;
          *piVar19 = iVar7;
          piVar19 = piVar19 + 1;
        }
      } while ((piVar29 < piVar4) && (piVar18 < piVar30));
    }
    for (; piVar29 < piVar4; piVar29 = piVar29 + 1) {
      *piVar24 = *piVar29;
      piVar24 = piVar24 + 1;
    }
    for (; piVar18 < piVar30; piVar18 = piVar18 + 1) {
      *piVar19 = *piVar18;
      piVar19 = piVar19 + 1;
    }
    iVar17 = (int)((ulong)((long)piVar24 - (long)pVVar28[uVar12].pArray) >> 2);
    if (pVVar28[uVar12].nSize < iVar17) goto LAB_002cf4a9;
    pVVar28[uVar12].nSize = iVar17;
    iVar17 = (int)((ulong)((long)piVar19 - (long)pVVar28[uVar22].pArray) >> 2);
    if (pVVar28[uVar22].nSize < iVar17) goto LAB_002cf4a9;
    pVVar28[uVar22].nSize = iVar17;
    pVVar23 = p->vCubes;
  }
  pVVar3 = p->vLits;
  if (pVVar3->nSize <= (int)uVar25) goto LAB_002cf3ef;
  pVVar28 = pVVar3->pArray;
  pVVar8 = pVVar28 + uVar25;
  uVar12 = pVVar28[uVar25].nSize;
  if ((int)uVar12 < 1) {
    uVar22 = 0;
  }
  else {
    piVar4 = pVVar8->pArray;
    lVar31 = 0;
    uVar22 = 0;
    do {
      iVar17 = piVar4[lVar31];
      if (((long)iVar17 < 0) || (pVVar23->nSize <= iVar17)) goto LAB_002cf3ef;
      if (0 < pVVar23->pArray[iVar17].nSize) {
        if (((int)uVar22 < 0) || (uVar12 <= uVar22)) goto LAB_002cf48a;
        uVar16 = (ulong)uVar22;
        uVar22 = uVar22 + 1;
        piVar4[uVar16] = iVar17;
        uVar12 = pVVar8->nSize;
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < (int)uVar12);
  }
  if ((int)uVar12 < (int)uVar22) goto LAB_002cf4a9;
  pVVar8->nSize = uVar22;
  if (pVVar3->nSize <= (int)uVar26) goto LAB_002cf3ef;
  pVVar9 = pVVar28 + uVar26;
  uVar12 = pVVar28[uVar26].nSize;
  if ((int)uVar12 < 1) {
    uVar22 = 0;
  }
  else {
    piVar4 = pVVar9->pArray;
    lVar31 = 0;
    uVar22 = 0;
    do {
      iVar17 = piVar4[lVar31];
      if (((long)iVar17 < 0) || (pVVar23->nSize <= iVar17)) goto LAB_002cf3ef;
      if (0 < pVVar23->pArray[iVar17].nSize) {
        if (((int)uVar22 < 0) || (uVar12 <= uVar22)) goto LAB_002cf48a;
        uVar16 = (ulong)uVar22;
        uVar22 = uVar22 + 1;
        piVar4[uVar16] = iVar17;
        uVar12 = pVVar9->nSize;
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < (int)uVar12);
  }
  if ((int)uVar12 < (int)uVar22) goto LAB_002cf4a9;
  pVVar9->nSize = uVar22;
  if ((pVVar3->nSize <= (int)uVar25) || (pVVar3->nSize <= (int)uVar26)) goto LAB_002cf3ef;
  pVVar28 = p_00;
  Fx_ManFindCommonPairs
            (pVVar23,pVVar8,pVVar9,p->vCubesD,p->vCompls,p_00,p->vCubeFree,in_stack_ffffffffffffff80
            );
  pVVar8 = p->vCubesS;
  if (0 < pVVar8->nSize) {
    lVar31 = 0;
    do {
      iVar17 = pVVar8->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar9 = p->vCubes->pArray;
      if (pVVar9 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar9 + iVar17,1,1);
      lVar31 = lVar31 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar31 < pVVar8->nSize);
  }
  pVVar9 = p->vCubesD;
  uVar12 = pVVar9->nSize;
  uVar16 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar31 = 0;
    do {
      uVar12 = (uint)uVar16;
      iVar17 = pVVar9->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar8 + iVar17,1,1);
      lVar31 = lVar31 + 1;
      pVVar9 = p->vCubesD;
      uVar12 = pVVar9->nSize;
      uVar16 = (ulong)(int)uVar12;
    } while (lVar31 < (long)uVar16);
    pVVar8 = p->vCubesS;
  }
  pVVar23 = p->vCubes;
  iVar17 = pVVar8->nSize;
  if (0 < (long)iVar17) {
    piVar4 = pVVar8->pArray;
    pVVar28 = (Vec_Int_t *)0x0;
    do {
      lVar31 = (long)piVar4[(long)pVVar28];
      if ((lVar31 < 0) || (pVVar23->nSize <= piVar4[(long)pVVar28])) goto LAB_002cf3ef;
      uVar22 = pVVar23->pArray[lVar31].nCap;
      if ((uVar22 >> 0x1e & 1) != 0) goto LAB_002cf44c;
      pVVar23->pArray[lVar31].nCap = uVar22 | 0x40000000;
      pVVar28 = (Vec_Int_t *)((long)&pVVar28->nCap + 1);
    } while ((Vec_Int_t *)(long)iVar17 != pVVar28);
  }
  if (0 < (int)uVar12) {
    piVar4 = pVVar9->pArray;
    pVVar28 = (Vec_Int_t *)0x0;
    do {
      lVar31 = (long)piVar4[(long)pVVar28];
      if ((lVar31 < 0) || (pVVar23->nSize <= piVar4[(long)pVVar28])) goto LAB_002cf3ef;
      uVar22 = pVVar23->pArray[lVar31].nCap;
      if ((uVar22 >> 0x1e & 1) != 0) goto LAB_002cf44c;
      pVVar23->pArray[lVar31].nCap = uVar22 | 0x40000000;
      pVVar28 = (Vec_Int_t *)((long)&pVVar28->nCap + 1);
    } while ((Vec_Int_t *)(ulong)uVar12 != pVVar28);
  }
  if (0 < iVar17) {
    lVar31 = 0;
    do {
      iVar17 = pVVar8->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar9 = p->vCubes->pArray;
      if (pVVar9 == (Vec_Int_t *)0x0) break;
      pVVar9 = pVVar9 + iVar17;
      if (pVVar9->nSize < 1) goto LAB_002cf40e;
      iVar17 = *pVVar9->pArray;
      if (((long)iVar17 < 0) || (p->vVarCube->nSize <= iVar17)) goto LAB_002cf40e;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar17],pVVar9,1,1,&pVVar28->nCap);
      lVar31 = lVar31 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar31 < pVVar8->nSize);
    pVVar9 = p->vCubesD;
  }
  uVar12 = pVVar9->nSize;
  uVar16 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar31 = 0;
    do {
      uVar12 = (uint)uVar16;
      iVar17 = pVVar9->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      pVVar8 = pVVar8 + iVar17;
      if (pVVar8->nSize < 1) goto LAB_002cf40e;
      iVar17 = *pVVar8->pArray;
      if (((long)iVar17 < 0) || (p->vVarCube->nSize <= iVar17)) goto LAB_002cf40e;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar17],pVVar8,1,1,&pVVar28->nCap);
      lVar31 = lVar31 + 1;
      pVVar9 = p->vCubesD;
      uVar12 = pVVar9->nSize;
      uVar16 = (ulong)(int)uVar12;
    } while (lVar31 < (long)uVar16);
    pVVar8 = p->vCubesS;
  }
  pVVar23 = p->vCubes;
  iVar17 = pVVar8->nSize;
  if (0 < (long)iVar17) {
    piVar4 = pVVar8->pArray;
    lVar31 = 0;
    do {
      iVar7 = piVar4[lVar31];
      if (((long)iVar7 < 0) || (pVVar23->nSize <= iVar7)) goto LAB_002cf3ef;
      pVVar28 = (Vec_Int_t *)((long)iVar7 * 0x10);
      uVar22 = *(uint *)((long)&pVVar28->nCap + (long)pVVar23->pArray);
      if ((uVar22 >> 0x1e & 1) == 0) goto LAB_002cf46b;
      *(uint *)((long)&pVVar28->nCap + (long)pVVar23->pArray) = uVar22 & 0xbfffffff;
      lVar31 = lVar31 + 1;
    } while (iVar17 != lVar31);
  }
  if (0 < (int)uVar12) {
    piVar4 = pVVar9->pArray;
    uVar16 = 0;
    do {
      lVar31 = (long)piVar4[uVar16];
      if ((lVar31 < 0) || (pVVar23->nSize <= piVar4[uVar16])) goto LAB_002cf3ef;
      uVar22 = pVVar23->pArray[lVar31].nCap;
      if ((uVar22 >> 0x1e & 1) == 0) goto LAB_002cf46b;
      uVar22 = uVar22 & 0xbfffffff;
      pVVar28 = (Vec_Int_t *)(ulong)uVar22;
      pVVar23->pArray[lVar31].nCap = uVar22;
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
  }
  if ((uVar26 ^ uVar25) < 2) {
    pHVar2 = p->pHash;
    if (pHVar2->vMap->nSize <= iDiv) goto LAB_002cf40e;
    iVar17 = pHVar2->vMap->pArray[(uint)iDiv];
    if (((long)iVar17 < 0) || (pHVar2->vData->nSize <= iVar17)) goto LAB_002cf563;
    piVar4 = pHVar2->vData->pArray + iVar17;
    iVar17 = *piVar4;
    (pHVar2->vTemp).nCap = iVar17;
    (pHVar2->vTemp).nSize = iVar17;
    (pHVar2->vTemp).pArray = piVar4 + 2;
    if (iVar17 != 2) goto LAB_002ce4f9;
    local_48 = (Vec_Int_t *)0x0;
    local_68 = (Vec_Int_t *)0x0;
    iVar7 = 0;
  }
  else {
LAB_002ce4f9:
    iVar17 = p->vLits->nSize;
    iVar7 = iVar17 / 2;
    if (p->vVarCube->nSize != iVar7) {
      __assert_fail("Vec_IntSize(p->vVarCube) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                    ,0x3fc,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    Vec_IntPush(p->vVarCube,pVVar23->nSize);
    pVVar8 = Vec_WecPushLevel(p->vCubes);
    Vec_IntPush(pVVar8,iVar7);
    if (p_00->nSize == 2) {
      Vec_IntPush(pVVar8,uVar25 ^ 1);
      Vec_IntPush(pVVar8,uVar26 ^ 1);
      iVar20 = 1;
      if (1 < (long)pVVar8->nSize) {
        iVar20 = 0;
        lVar31 = 1;
        do {
          if (pVVar8->pArray[lVar31] < 0) goto LAB_002cf4c8;
          uVar12 = (uint)pVVar8->pArray[lVar31] >> 1;
          if (p->vLevels->nSize <= (int)uVar12) goto LAB_002cf40e;
          iVar5 = p->vLevels->pArray[uVar12];
          if (iVar20 <= iVar5) {
            iVar20 = iVar5;
          }
          lVar31 = lVar31 + 1;
        } while (pVVar8->nSize != lVar31);
        iVar20 = iVar20 + 1;
      }
    }
    else {
      pVVar8 = Vec_WecPushLevel(p->vCubes);
      lVar31 = (long)p->vCubes->nSize;
      if (lVar31 < 2) goto LAB_002cf3ef;
      pVVar28 = p->vCubes->pArray;
      Vec_IntPush(pVVar8,iVar7);
      if (0 < p_00->nSize) {
        lVar14 = 0;
        do {
          uVar12 = p_00->pArray[lVar14];
          if ((int)uVar12 < 0) {
LAB_002cf4e7:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          pVVar9 = pVVar8;
          if ((uVar12 & 1) == 0) {
            pVVar9 = pVVar28 + lVar31 + -2;
          }
          Vec_IntPush(pVVar9,uVar12 >> 1);
          lVar14 = lVar14 + 1;
        } while (lVar14 < p_00->nSize);
        if ((p_00->nSize == 4) && (pVVar28[lVar31 + -2].nSize == 3)) {
          if (pVVar8->nSize != 3) {
            __assert_fail("Vec_IntSize(vCube2) == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                          ,0x2b3,"void Fx_ManDivAddLits(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
          }
          piVar4 = pVVar28[lVar31 + -2].pArray;
          iVar20 = piVar4[1];
          if (piVar4[2] < iVar20) {
            piVar4[1] = piVar4[2];
            piVar4[2] = iVar20;
          }
          piVar4 = pVVar8->pArray;
          iVar20 = piVar4[1];
          if (piVar4[2] < iVar20) {
            piVar4[1] = piVar4[2];
            piVar4[2] = iVar20;
          }
        }
      }
      iVar20 = 0;
      iVar5 = 0;
      if (1 < (long)pVVar28[lVar31 + -2].nSize) {
        iVar5 = 0;
        lVar14 = 1;
        do {
          if (pVVar28[lVar31 + -2].pArray[lVar14] < 0) goto LAB_002cf4c8;
          uVar12 = (uint)pVVar28[lVar31 + -2].pArray[lVar14] >> 1;
          if (p->vLevels->nSize <= (int)uVar12) goto LAB_002cf40e;
          iVar6 = p->vLevels->pArray[uVar12];
          if (iVar5 <= iVar6) {
            iVar5 = iVar6;
          }
          lVar14 = lVar14 + 1;
        } while (pVVar28[lVar31 + -2].nSize != lVar14);
      }
      if (1 < (long)pVVar8->nSize) {
        iVar20 = 0;
        lVar31 = 1;
        do {
          if (pVVar8->pArray[lVar31] < 0) goto LAB_002cf4c8;
          uVar12 = (uint)pVVar8->pArray[lVar31] >> 1;
          if (p->vLevels->nSize <= (int)uVar12) goto LAB_002cf40e;
          iVar6 = p->vLevels->pArray[uVar12];
          if (iVar20 <= iVar6) {
            iVar20 = iVar6;
          }
          lVar31 = lVar31 + 1;
        } while (pVVar8->nSize != lVar31);
      }
      if (iVar20 < iVar5) {
        iVar20 = iVar5;
      }
      iVar20 = iVar20 + 2;
    }
    if (p->vLevels->nSize != iVar7) {
      __assert_fail("Vec_IntSize(p->vLevels) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                    ,0x40e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    Vec_IntPush(p->vLevels,iVar20);
    p->nLits = p->nLits + p_00->nSize;
    Vec_WecPushLevel(p->vLits);
    local_48 = Vec_WecPushLevel(p->vLits);
    lVar31 = (long)p->vLits->nSize;
    if (lVar31 < 2) goto LAB_002cf3ef;
    local_68 = p->vLits->pArray + lVar31 + -2;
    pVVar8 = p->vCubesS;
    pVVar28 = (Vec_Int_t *)(ulong)uVar25;
    if (0 < pVVar8->nSize) {
      lVar31 = 0;
LAB_002ce79a:
      pVVar28 = (Vec_Int_t *)(ulong)uVar25;
      iVar20 = pVVar8->pArray[lVar31];
      if (((long)iVar20 < 0) || (p->vCubes->nSize <= iVar20)) goto LAB_002cf3ef;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 != (Vec_Int_t *)0x0) {
        pVVar8 = pVVar8 + iVar20;
        iVar20 = pVVar8->nSize;
        uVar16 = (ulong)iVar20;
        iVar5 = 0;
        if (1 < (long)uVar16) {
          piVar4 = pVVar8->pArray;
          uVar27 = 2;
LAB_002ce7ea:
          if ((piVar4[uVar27 - 1] ^ uVar25) != 1) goto code_r0x002ce7f8;
          if ((int)uVar27 < iVar20) {
            do {
              piVar4[uVar27 - 1] = piVar4[uVar27];
              uVar27 = uVar27 + 1;
              iVar20 = pVVar8->nSize;
            } while ((int)uVar27 < iVar20);
          }
          uVar16 = (ulong)(iVar20 - 1U);
          pVVar8->nSize = iVar20 - 1U;
          iVar20 = 1;
          goto LAB_002ce833;
        }
        iVar20 = 0;
        goto LAB_002ce88b;
      }
    }
  }
LAB_002ce908:
  p->nCompls = 0;
  pVVar8 = p->vCubesD;
  uVar26 = pVVar8->nSize;
  if ((uVar26 & 1) != 0) {
    __assert_fail("Vec_IntSize(p->vCubesD) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x424,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if (uVar26 != p->vCompls->nSize * 2) {
    __assert_fail("Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x425,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if ((int)uVar26 < 1) {
    uVar16 = 0;
  }
  else {
    uVar27 = 0;
    uVar16 = 0;
    do {
      if ((long)p->vCompls->nSize <= (long)(uVar27 >> 1)) goto LAB_002cf40e;
      iVar17 = p->vCompls->pArray[uVar27 >> 1];
      p->nCompls = p->nCompls + iVar17;
      iVar20 = pVVar8->pArray[uVar27];
      if ((long)iVar20 < 0) goto LAB_002cf3ef;
      uVar12 = p->vCubes->nSize;
      if ((int)uVar12 <= iVar20) goto LAB_002cf3ef;
      if ((long)(int)uVar26 <= (long)(uVar27 | 1)) goto LAB_002cf40e;
      uVar26 = pVVar8->pArray[uVar27 | 1];
      if (((long)(int)uVar26 < 0) || (uVar12 <= uVar26)) goto LAB_002cf3ef;
      pVVar9 = p->vCubes->pArray;
      pVVar11 = pVVar9 + iVar20;
      pVVar9 = pVVar9 + (int)uVar26;
      iVar5 = Fx_ManDivRemoveLits(pVVar11,p_00,iVar17);
      iVar6 = Fx_ManDivRemoveLits(pVVar9,p_00,iVar17);
      iVar20 = p_00->nSize;
      if ((iVar6 + iVar5 != iVar20) && (iVar6 + iVar5 != iVar20 + 1)) {
        __assert_fail("RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                      ,0x42e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
      }
      if (0 < iVar7) {
        if ((iVar20 == 2) || (iVar17 != 0)) {
          Vec_IntPush(pVVar11,iVar7 * 2 + 1);
          pVVar8 = p->vCubes->pArray;
          if (pVVar11 < pVVar8) goto LAB_002cf42d;
          pVVar13 = pVVar8 + p->vCubes->nSize;
          pVVar10 = local_48;
        }
        else {
          Vec_IntPush(pVVar11,iVar7 * 2);
          pVVar8 = p->vCubes->pArray;
          if (pVVar11 < pVVar8) goto LAB_002cf42d;
          pVVar13 = pVVar8 + p->vCubes->nSize;
          pVVar10 = local_68;
        }
        if (pVVar13 <= pVVar11) goto LAB_002cf42d;
        Vec_IntPush(pVVar10,(int)((ulong)((long)pVVar11 - (long)pVVar8) >> 4));
      }
      p->nLits = (p->nLits - (p_00->nSize + pVVar9->nSize)) + 2;
      pVVar10 = p->vCubes->pArray;
      if ((pVVar11 < pVVar10) || (pVVar10 + p->vCubes->nSize <= pVVar11)) goto LAB_002cf42d;
      pVVar8 = p->vCubesD;
      if ((long)pVVar8->nSize <= (long)uVar16) {
LAB_002cf48a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar8->pArray[uVar16] = (int)((ulong)((long)pVVar11 - (long)pVVar10) >> 4);
      uVar16 = uVar16 + 1;
      pVVar9->nSize = 0;
      uVar27 = uVar27 + 2;
      uVar26 = pVVar8->nSize;
    } while ((int)uVar27 < (int)uVar26);
  }
  iVar17 = (int)uVar16;
  if (iVar17 != (int)uVar26 / 2) {
    __assert_fail("k == Vec_IntSize(p->vCubesD) / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x442,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if ((int)uVar26 < iVar17) {
LAB_002cf4a9:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar8->nSize = iVar17;
  qsort(pVVar8->pArray,uVar16 & 0xffffffff,4,Vec_IntSortCompare1);
  pVVar8 = p->vCubesS;
  if (0 < pVVar8->nSize) {
    lVar31 = 0;
    do {
      iVar17 = pVVar8->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar9 = p->vCubes->pArray;
      if (pVVar9 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar9 + iVar17,0,1);
      lVar31 = lVar31 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar31 < pVVar8->nSize);
  }
  pVVar9 = p->vCubesD;
  uVar26 = pVVar9->nSize;
  uVar16 = (ulong)uVar26;
  if (0 < (int)uVar26) {
    lVar31 = 0;
    do {
      uVar26 = (uint)uVar16;
      iVar17 = pVVar9->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar8 + iVar17,0,1);
      lVar31 = lVar31 + 1;
      pVVar9 = p->vCubesD;
      uVar26 = pVVar9->nSize;
      uVar16 = (ulong)(int)uVar26;
    } while (lVar31 < (long)uVar16);
    pVVar8 = p->vCubesS;
  }
  pVVar23 = p->vCubes;
  iVar17 = pVVar8->nSize;
  if (0 < (long)iVar17) {
    piVar4 = pVVar8->pArray;
    pVVar28 = (Vec_Int_t *)0x0;
    do {
      lVar31 = (long)piVar4[(long)pVVar28];
      if ((lVar31 < 0) || (pVVar23->nSize <= piVar4[(long)pVVar28])) goto LAB_002cf3ef;
      uVar12 = pVVar23->pArray[lVar31].nCap;
      if ((uVar12 >> 0x1e & 1) != 0) goto LAB_002cf44c;
      pVVar23->pArray[lVar31].nCap = uVar12 | 0x40000000;
      pVVar28 = (Vec_Int_t *)((long)&pVVar28->nCap + 1);
    } while ((Vec_Int_t *)(long)iVar17 != pVVar28);
  }
  if (0 < (int)uVar26) {
    piVar4 = pVVar9->pArray;
    pVVar28 = (Vec_Int_t *)0x0;
    do {
      lVar31 = (long)piVar4[(long)pVVar28];
      if ((lVar31 < 0) || (pVVar23->nSize <= piVar4[(long)pVVar28])) goto LAB_002cf3ef;
      uVar12 = pVVar23->pArray[lVar31].nCap;
      if ((uVar12 >> 0x1e & 1) != 0) {
LAB_002cf44c:
        __assert_fail("!Vec_WecIntHasMark( vCube )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x2b6,"void Vec_WecMarkLevels(Vec_Wec_t *, Vec_Int_t *)");
      }
      pVVar23->pArray[lVar31].nCap = uVar12 | 0x40000000;
      pVVar28 = (Vec_Int_t *)((long)&pVVar28->nCap + 1);
    } while ((Vec_Int_t *)(ulong)uVar26 != pVVar28);
  }
  if (0 < iVar17) {
    lVar31 = 0;
    do {
      iVar17 = pVVar8->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar9 = p->vCubes->pArray;
      if (pVVar9 == (Vec_Int_t *)0x0) break;
      pVVar9 = pVVar9 + iVar17;
      if (pVVar9->nSize < 1) goto LAB_002cf40e;
      iVar17 = *pVVar9->pArray;
      if (((long)iVar17 < 0) || (p->vVarCube->nSize <= iVar17)) goto LAB_002cf40e;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar17],pVVar9,0,1,&pVVar28->nCap);
      lVar31 = lVar31 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar31 < pVVar8->nSize);
    pVVar9 = p->vCubesD;
  }
  uVar26 = pVVar9->nSize;
  uVar16 = (ulong)uVar26;
  if (0 < (int)uVar26) {
    lVar31 = 0;
    do {
      uVar26 = (uint)uVar16;
      iVar17 = pVVar9->pArray[lVar31];
      if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      pVVar8 = pVVar8 + iVar17;
      if (pVVar8->nSize < 1) goto LAB_002cf40e;
      iVar17 = *pVVar8->pArray;
      if (((long)iVar17 < 0) || (p->vVarCube->nSize <= iVar17)) goto LAB_002cf40e;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar17],pVVar8,0,1,&pVVar28->nCap);
      lVar31 = lVar31 + 1;
      pVVar9 = p->vCubesD;
      uVar26 = pVVar9->nSize;
      uVar16 = (ulong)(int)uVar26;
    } while (lVar31 < (long)uVar16);
    pVVar8 = p->vCubesS;
  }
  pVVar23 = p->vCubes;
  iVar17 = pVVar8->nSize;
  if (0 < (long)iVar17) {
    piVar4 = pVVar8->pArray;
    lVar31 = 0;
    do {
      iVar7 = piVar4[lVar31];
      if (((long)iVar7 < 0) || (pVVar23->nSize <= iVar7)) goto LAB_002cf3ef;
      pVVar28 = (Vec_Int_t *)((long)iVar7 * 0x10);
      uVar12 = *(uint *)((long)&pVVar28->nCap + (long)pVVar23->pArray);
      if ((uVar12 >> 0x1e & 1) == 0) goto LAB_002cf46b;
      *(uint *)((long)&pVVar28->nCap + (long)pVVar23->pArray) = uVar12 & 0xbfffffff;
      lVar31 = lVar31 + 1;
    } while (iVar17 != lVar31);
  }
  if (0 < (int)uVar26) {
    piVar4 = pVVar9->pArray;
    uVar16 = 0;
    do {
      lVar31 = (long)piVar4[uVar16];
      if ((lVar31 < 0) || (pVVar23->nSize <= piVar4[uVar16])) goto LAB_002cf3ef;
      uVar12 = pVVar23->pArray[lVar31].nCap;
      if ((uVar12 >> 0x1e & 1) == 0) {
LAB_002cf46b:
        __assert_fail("Vec_WecIntHasMark( vCube )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x2c0,"void Vec_WecUnmarkLevels(Vec_Wec_t *, Vec_Int_t *)");
      }
      uVar12 = uVar12 & 0xbfffffff;
      pVVar28 = (Vec_Int_t *)(ulong)uVar12;
      pVVar23->pArray[lVar31].nCap = uVar12;
      uVar16 = uVar16 + 1;
    } while (uVar26 != uVar16);
  }
  pVVar8 = p->vSCC;
  uVar26 = pVVar8->nSize;
  if ((ulong)uVar26 != 0) {
    if (1 < (int)uVar26) {
      qsort(pVVar8->pArray,(ulong)uVar26,4,Vec_IntSortCompare1);
      iVar17 = pVVar8->nSize;
      iVar7 = 1;
      if (1 < iVar17) {
        piVar4 = pVVar8->pArray;
        lVar31 = 1;
        do {
          if (piVar4[lVar31] != piVar4[lVar31 + -1]) {
            lVar14 = (long)iVar7;
            iVar7 = iVar7 + 1;
            piVar4[lVar14] = piVar4[lVar31];
            iVar17 = pVVar8->nSize;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < iVar17);
      }
      pVVar8->nSize = iVar7;
      pVVar8 = p->vSCC;
      uVar26 = pVVar8->nSize;
    }
    if (0 < (int)uVar26) {
      lVar31 = 0;
      do {
        iVar17 = pVVar8->pArray[lVar31];
        if (((long)iVar17 < 0) || (p->vCubes->nSize <= iVar17)) goto LAB_002cf3ef;
        pVVar9 = p->vCubes->pArray;
        if (pVVar9 == (Vec_Int_t *)0x0) break;
        pVVar9 = pVVar9 + iVar17;
        if (pVVar9->nSize < 1) goto LAB_002cf40e;
        iVar17 = *pVVar9->pArray;
        if (((long)iVar17 < 0) || (p->vVarCube->nSize <= iVar17)) goto LAB_002cf40e;
        Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar17],pVVar9,1,1,&pVVar28->nCap);
        pVVar9->nSize = 0;
        lVar31 = lVar31 + 1;
        pVVar8 = p->vSCC;
      } while (lVar31 < pVVar8->nSize);
    }
    pVVar8->nSize = 0;
  }
  iVar17 = p_00->nSize;
  if (2 < iVar17) {
    lVar31 = (long)p->vCubes->nSize;
    if (lVar31 < 2) {
LAB_002cf3ef:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar8 = p->vCubes->pArray;
    pVVar9 = pVVar8 + lVar31 + -2;
    pVVar28 = pVVar8 + lVar31 + -1;
    Fx_ManCubeSingleCubeDivisors(p,pVVar9,0,1);
    Fx_ManCubeSingleCubeDivisors(p,pVVar28,0,1);
    if (1 < pVVar8[lVar31 + -2].nSize) {
      lVar14 = 1;
      do {
        pVVar11 = p->vCubes->pArray;
        if ((pVVar9 < pVVar11) || (pVVar11 + p->vCubes->nSize <= pVVar9)) goto LAB_002cf42d;
        uVar26 = pVVar8[lVar31 + -2].pArray[lVar14];
        pVVar23 = p->vLits;
        iVar17 = pVVar23->nSize;
        if (iVar17 <= (int)uVar26) {
          iVar20 = uVar26 + 1;
          iVar7 = iVar17 * 2;
          if (iVar17 * 2 <= iVar20) {
            iVar7 = iVar20;
          }
          iVar17 = pVVar23->nCap;
          if (iVar17 < iVar7) {
            if (pVVar23->pArray == (Vec_Int_t *)0x0) {
              pVVar10 = (Vec_Int_t *)malloc((long)iVar7 << 4);
            }
            else {
              pVVar10 = (Vec_Int_t *)realloc(pVVar23->pArray,(long)iVar7 << 4);
              iVar17 = pVVar23->nCap;
            }
            pVVar23->pArray = pVVar10;
            memset(pVVar10 + iVar17,0,(long)(iVar7 - iVar17) << 4);
            pVVar23->nCap = iVar7;
          }
          pVVar23->nSize = iVar20;
          iVar17 = iVar20;
        }
        if (((int)uVar26 < 0) || (iVar17 <= (int)uVar26)) goto LAB_002cf3ef;
        Vec_IntPush(pVVar23->pArray + uVar26,(int)((ulong)((long)pVVar9 - (long)pVVar11) >> 4));
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar8[lVar31 + -2].nSize);
    }
    if (1 < pVVar8[lVar31 + -1].nSize) {
      lVar14 = 1;
      do {
        pVVar9 = p->vCubes->pArray;
        if ((pVVar28 < pVVar9) || (pVVar9 + p->vCubes->nSize <= pVVar28)) {
LAB_002cf42d:
          __assert_fail("p->pArray <= vLevel && vLevel < p->pArray + p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0xba,"int Vec_WecLevelId(Vec_Wec_t *, Vec_Int_t *)");
        }
        uVar26 = pVVar8[lVar31 + -1].pArray[lVar14];
        pVVar23 = p->vLits;
        iVar17 = pVVar23->nSize;
        if (iVar17 <= (int)uVar26) {
          iVar20 = uVar26 + 1;
          iVar7 = iVar17 * 2;
          if (iVar17 * 2 <= iVar20) {
            iVar7 = iVar20;
          }
          iVar17 = pVVar23->nCap;
          if (iVar17 < iVar7) {
            if (pVVar23->pArray == (Vec_Int_t *)0x0) {
              pVVar11 = (Vec_Int_t *)malloc((long)iVar7 << 4);
            }
            else {
              pVVar11 = (Vec_Int_t *)realloc(pVVar23->pArray,(long)iVar7 << 4);
              iVar17 = pVVar23->nCap;
            }
            pVVar23->pArray = pVVar11;
            memset(pVVar11 + iVar17,0,(long)(iVar7 - iVar17) << 4);
            pVVar23->nCap = iVar7;
          }
          pVVar23->nSize = iVar20;
          iVar17 = iVar20;
        }
        if (((int)uVar26 < 0) || (iVar17 <= (int)uVar26)) goto LAB_002cf3ef;
        Vec_IntPush(pVVar23->pArray + uVar26,(int)((ulong)((long)pVVar28 - (long)pVVar9) >> 4));
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar8[lVar31 + -1].nSize);
    }
    iVar17 = p_00->nSize;
  }
  if (0 < iVar17) {
    piVar4 = p_00->pArray;
    pVVar23 = p->vLits;
    uVar16 = 0;
    do {
      if (piVar4[uVar16] < 0) {
LAB_002cf4c8:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar26 = (uint)piVar4[uVar16] >> 1;
      if (pVVar23->nSize <= (int)uVar26) goto LAB_002cf3ef;
      pVVar8 = pVVar23->pArray;
      pVVar28 = p->vCubesD;
      iVar17 = pVVar28->nSize;
      piVar24 = pVVar28->pArray;
      piVar18 = pVVar8[uVar26].pArray;
      iVar7 = pVVar8[uVar26].nSize;
      piVar19 = piVar18;
      piVar29 = piVar18;
      if (0 < iVar17 && 0 < (long)iVar7) {
        piVar30 = piVar24;
        do {
          iVar20 = *piVar29;
          if (iVar20 == *piVar30) {
            piVar29 = piVar29 + 1;
LAB_002cf2c5:
            piVar30 = piVar30 + 1;
          }
          else {
            if (*piVar30 <= iVar20) goto LAB_002cf2c5;
            piVar29 = piVar29 + 1;
            *piVar19 = iVar20;
            piVar19 = piVar19 + 1;
          }
        } while ((piVar29 < piVar18 + iVar7) && (piVar30 < piVar24 + iVar17));
      }
      for (; piVar29 < piVar18 + iVar7; piVar29 = piVar29 + 1) {
        *piVar19 = *piVar29;
        piVar19 = piVar19 + 1;
      }
      iVar17 = (int)((ulong)((long)piVar19 - (long)piVar18) >> 2);
      if (pVVar8[uVar26].nSize < iVar17) goto LAB_002cf4a9;
      pVVar8[uVar26].nSize = iVar17;
      if (((1 < uVar16) && (p->nCompls != 0)) || (iVar17 = p_00->nSize, iVar17 == 2)) {
        uVar26 = uVar26 ^ 1;
        if (pVVar23->nSize <= (int)uVar26) goto LAB_002cf3ef;
        piVar18 = pVVar8[uVar26].pArray;
        iVar17 = pVVar8[uVar26].nSize;
        piVar19 = piVar18;
        piVar29 = piVar18;
        if (0 < pVVar28->nSize && 0 < (long)iVar17) {
          piVar30 = piVar24 + pVVar28->nSize;
          do {
            iVar7 = *piVar19;
            if (iVar7 == *piVar24) {
              piVar19 = piVar19 + 1;
LAB_002cf392:
              piVar24 = piVar24 + 1;
            }
            else {
              if (*piVar24 <= iVar7) goto LAB_002cf392;
              piVar19 = piVar19 + 1;
              *piVar29 = iVar7;
              piVar29 = piVar29 + 1;
            }
          } while ((piVar19 < piVar18 + iVar17) && (piVar24 < piVar30));
        }
        for (; piVar19 < piVar18 + iVar17; piVar19 = piVar19 + 1) {
          *piVar29 = *piVar19;
          piVar29 = piVar29 + 1;
        }
        iVar17 = (int)((ulong)((long)piVar29 - (long)piVar18) >> 2);
        if (pVVar8[uVar26].nSize < iVar17) goto LAB_002cf4a9;
        pVVar8[uVar26].nSize = iVar17;
        iVar17 = p_00->nSize;
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)iVar17);
  }
  return;
code_r0x002ce7f8:
  bVar32 = uVar27 == uVar16;
  uVar27 = uVar27 + 1;
  if (bVar32) goto code_r0x002ce808;
  goto LAB_002ce7ea;
code_r0x002ce808:
  iVar20 = 0;
LAB_002ce833:
  iVar6 = (int)uVar16;
  if (1 < iVar6) {
    lVar14 = 2;
LAB_002ce848:
    if ((piVar4[lVar14 + -1] ^ uVar26) != 1) goto code_r0x002ce856;
    if ((int)lVar14 < iVar6) {
      do {
        piVar4[lVar14 + -1] = piVar4[lVar14];
        lVar14 = lVar14 + 1;
        iVar6 = pVVar8->nSize;
      } while ((int)lVar14 < iVar6);
    }
    pVVar8->nSize = iVar6 + -1;
    iVar5 = 1;
  }
LAB_002ce88b:
  if (iVar20 + iVar5 != 2) {
    __assert_fail("RetValue == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x41b,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if (iVar17 < -1) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  Vec_IntPush(pVVar8,iVar7 * 2);
  pVVar28 = p->vCubes->pArray;
  if ((pVVar8 < pVVar28) || (pVVar28 + p->vCubes->nSize <= pVVar8)) goto LAB_002cf42d;
  Vec_IntPush(local_68,(int)((ulong)((long)pVVar8 - (long)pVVar28) >> 4));
  p->nLits = p->nLits + -1;
  lVar31 = lVar31 + 1;
  pVVar8 = p->vCubesS;
  pVVar28 = (Vec_Int_t *)(ulong)uVar25;
  if (pVVar8->nSize <= lVar31) goto LAB_002ce908;
  goto LAB_002ce79a;
code_r0x002ce856:
  lVar1 = (1 - (uVar16 & 0xffffffff)) + lVar14;
  lVar14 = lVar14 + 1;
  if (lVar1 == 1) goto LAB_002ce88b;
  goto LAB_002ce848;
}

Assistant:

void Fx_ManUpdate( Fx_Man_t * p, int iDiv, int * fWarning )
{
    Vec_Int_t * vCube, * vCube2, * vLitP = NULL, * vLitN = NULL;
    Vec_Int_t * vDiv = p->vDiv;
    int i, k, Lit0, Lit1, iVarNew = 0, RetValue, Level;
    float Diff = Vec_FltEntry(p->vWeights, iDiv) - (float)((int)Vec_FltEntry(p->vWeights, iDiv));
    assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    p->nDivs++;
    Vec_IntClear( vDiv );
    Vec_IntAppend( vDiv, Hsh_VecReadEntry(p->pHash, iDiv) );
    Fx_ManDivFindPivots( vDiv, &Lit0, &Lit1 );
    assert( Lit0 >= 0 && Lit1 >= 0 );


    // collect single-cube-divisor cubes
    Vec_IntClear( p->vCubesS );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)) );
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)), Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)), p->vCubesS );
    }

    // collect double-cube-divisor cube pairs
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit0) );
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit1) );
    Fx_ManFindCommonPairs( p->vCubes, Vec_WecEntry(p->vLits, Lit0), Vec_WecEntry(p->vLits, Lit1), p->vCubesD, p->vCompls, vDiv, p->vCubeFree, fWarning );

    // subtract cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // subtract cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) == 2 )
        goto ExtractFromPairs;

    // create new divisor
    iVarNew = Vec_WecSize( p->vLits ) / 2;
    assert( Vec_IntSize(p->vVarCube) == iVarNew );
    Vec_IntPush( p->vVarCube, Vec_WecSize(p->vCubes) );
    vCube = Vec_WecPushLevel( p->vCubes );
    Vec_IntPush( vCube, iVarNew );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Vec_IntPush( vCube, Abc_LitNot(Lit0) );
        Vec_IntPush( vCube, Abc_LitNot(Lit1) );
        Level = 1 + Fx_ManComputeLevelCube( p, vCube );
    }
    else
    {
        vCube2 = Vec_WecPushLevel( p->vCubes );
        vCube = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        Vec_IntPush( vCube2, iVarNew );
        Fx_ManDivAddLits( vCube, vCube2, vDiv );
        Level = 2 + Abc_MaxInt( Fx_ManComputeLevelCube(p, vCube), Fx_ManComputeLevelCube(p, vCube2) );
    }
    assert( Vec_IntSize(p->vLevels) == iVarNew );
    Vec_IntPush( p->vLevels, Level );
    // do not add new cubes to the matrix 
    p->nLits += Vec_IntSize( vDiv );
    // create new literals
    vLitP = Vec_WecPushLevel( p->vLits );
    vLitN = Vec_WecPushLevel( p->vLits );
    vLitP = Vec_WecEntry( p->vLits, Vec_WecSize(p->vLits) - 2 );
    // create updated single-cube divisor cubes
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
    {
        RetValue  = Vec_IntRemove1( vCube, Abc_LitNot(Lit0) );
        RetValue += Vec_IntRemove1( vCube, Abc_LitNot(Lit1) );
        assert( RetValue == 2 );
        Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
        Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) );
        p->nLits--;
    }
    // create updated double-cube divisor cube pairs
ExtractFromPairs:
    k = 0;
    p->nCompls = 0;
    assert( Vec_IntSize(p->vCubesD) % 2 == 0 );
    assert( Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls) );
    for ( i = 0; i < Vec_IntSize(p->vCubesD); i += 2 )
    {
        int fCompl = Vec_IntEntry(p->vCompls, i/2);
        p->nCompls += fCompl;
        vCube  = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i) );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i+1) );
        RetValue  = Fx_ManDivRemoveLits( vCube, vDiv, fCompl );  // cube 2*i
        RetValue += Fx_ManDivRemoveLits( vCube2, vDiv, fCompl ); // cube 2*i+1
        assert( RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1);
        if ( iVarNew > 0 )
        {
            if ( Vec_IntSize(vDiv) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 1) );
                Vec_IntPush( vLitN, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
            else 
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
                Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
        }
        p->nLits -= Vec_IntSize(vDiv) + Vec_IntSize(vCube2) - 2;

        // remove second cube
        Vec_IntWriteEntry( p->vCubesD, k++, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntClear( vCube2 ); 
    }
    assert( k == Vec_IntSize(p->vCubesD) / 2 );
    Vec_IntShrink( p->vCubesD, k );
    Vec_IntSort( p->vCubesD, 0 );
    //Vec_IntSort( vLitN, 0 );
    //Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // add cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    // Deal with SCC
    if ( Vec_IntSize( p->vSCC ) )
    {
        Vec_IntUniqify( p->vSCC );
        Fx_ManForEachCubeVec( p->vSCC, p->vCubes, vCube, i )
        {
            Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
            Vec_IntClear( vCube );
        }
        Vec_IntClear( p->vSCC );
    }
    // add cost of the new divisor
    if ( Vec_IntSize(vDiv) > 2 )
    {
        vCube  = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 1 );
        Fx_ManCubeSingleCubeDivisors( p, vCube,  0, 1 );  // add - update
        Fx_ManCubeSingleCubeDivisors( p, vCube2, 0, 1 );  // add - update
        Vec_IntForEachEntryStart( vCube, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntForEachEntryStart( vCube2, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube2) );
    }

    // remove these cubes from the lit array of the divisor
    Vec_IntForEachEntry( vDiv, Lit0, i )
    {
        Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_Lit2Var(Lit0)), p->vCubesD );
        if ( (p->nCompls && i > 1) || Vec_IntSize( vDiv ) == 2 ) // the last two lits are possibly complemented
            Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_LitNot(Abc_Lit2Var(Lit0))), p->vCubesD );
    }

}